

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDiscardTests.cpp
# Opt level: O0

void deqp::gles3::Functional::evalDiscardDynamic(ShaderEvalContext *c)

{
  float fVar1;
  float *pfVar2;
  VecAccess<float,_4,_3> local_38;
  undefined1 local_1c [20];
  ShaderEvalContext *c_local;
  
  local_1c._12_8_ = c;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_1c,(int)c,0,1);
  tcu::Vector<float,_4>::xyz(&local_38,(Vec4 *)(local_1c._12_8_ + 0x1f0));
  tcu::VecAccess<float,_4,_3>::operator=(&local_38,(Vector<float,_3> *)local_1c);
  pfVar2 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_1c._12_8_);
  fVar1 = *pfVar2;
  pfVar2 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_1c._12_8_);
  if (0.0 < fVar1 + *pfVar2) {
    deqp::gls::ShaderEvalContext::discard((ShaderEvalContext *)local_1c._12_8_);
  }
  return;
}

Assistant:

inline void evalDiscardDynamic	(ShaderEvalContext& c) { c.color.xyz() = c.coords.swizzle(0,1,2); if (c.coords.x()+c.coords.y() > 0.0f) c.discard(); }